

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsFieldGet(FmsField field,FmsFieldDescriptor *fd,FmsInt *num_vec_comp,
               FmsLayoutType *layout_type,FmsScalarType *data_type,void **data)

{
  void **data_local;
  FmsScalarType *data_type_local;
  FmsLayoutType *layout_type_local;
  FmsInt *num_vec_comp_local;
  FmsFieldDescriptor *fd_local;
  FmsField field_local;
  int local_4;
  
  if (field == (FmsField)0x0) {
    local_4 = 1;
  }
  else {
    if (fd != (FmsFieldDescriptor *)0x0) {
      *fd = field->fd;
    }
    if (num_vec_comp != (FmsInt *)0x0) {
      *num_vec_comp = field->num_vec_comp;
    }
    if (layout_type != (FmsLayoutType *)0x0) {
      *layout_type = field->layout;
    }
    if (data_type != (FmsScalarType *)0x0) {
      *data_type = field->scalar_type;
    }
    if (data != (void **)0x0) {
      *data = field->data;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsFieldGet(FmsField field, FmsFieldDescriptor *fd, FmsInt *num_vec_comp,
                FmsLayoutType *layout_type, FmsScalarType *data_type,
                const void **data) {
  if (!field) { E_RETURN(1); }
  if (fd) { *fd = field->fd; }
  if (num_vec_comp) { *num_vec_comp = field->num_vec_comp; }
  if (layout_type) { *layout_type = field->layout; }
  if (data_type) { *data_type = field->scalar_type; }
  if (data) { *data = field->data; }
  return 0;
}